

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QHash<int,_QVariant>_>::copyAppend
          (QGenericArrayOps<QHash<int,_QVariant>_> *this,QHash<int,_QVariant> *b,
          QHash<int,_QVariant> *e)

{
  QHash<int,_QVariant> *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if (b != e) {
    pQVar1 = (this->super_QArrayDataPointer<QHash<int,_QVariant>_>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QHash<int,_QVariant>_>).size;
      pDVar2 = b->d;
      pQVar1[lVar3].d = pDVar2;
      if ((pDVar2 != (Data *)0x0) &&
         ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QHash<int,_QVariant>_>).size;
      }
      (this->super_QArrayDataPointer<QHash<int,_QVariant>_>).size = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }